

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.h
# Opt level: O0

void __thiscall CPubKey::Unserialize<DataStream>(CPubKey *this,DataStream *s)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint64_t uVar4;
  CPubKey *in_RSI;
  DataStream *in_RDI;
  long in_FS_OFFSET;
  size_t unaff_retaddr;
  DataStream *in_stack_00000008;
  uint len;
  bool in_stack_00000047;
  DataStream *in_stack_00000048;
  CPubKey *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = ReadCompactSize<DataStream>(in_stack_00000048,in_stack_00000047);
  uVar2 = (uint)uVar4;
  if (uVar2 < 0x42) {
    Span<unsigned_char>::Span<unsigned_char,_0>
              ((Span<unsigned_char> *)in_RDI,
               (uchar *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),(size_t)in_RSI
              );
    DataStream::operator>>
              (in_RDI,(Span<unsigned_char> *)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    uVar3 = size(in_RSI);
    if (uVar2 != uVar3) {
      Invalidate(in_RSI);
    }
  }
  else {
    DataStream::ignore(in_stack_00000008,unaff_retaddr);
    Invalidate(in_stack_ffffffffffffffb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Unserialize(Stream& s)
    {
        const unsigned int len(::ReadCompactSize(s));
        if (len <= SIZE) {
            s >> Span{vch, len};
            if (len != size()) {
                Invalidate();
            }
        } else {
            // invalid pubkey, skip available data
            s.ignore(len);
            Invalidate();
        }
    }